

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O0

iu_ostream * iutest::operator<<(iu_ostream *os,TestPartResult *result)

{
  ostream *poVar1;
  string local_38;
  TestPartResult *local_18;
  TestPartResult *result_local;
  iu_ostream *os_local;
  
  local_18 = result;
  result_local = (TestPartResult *)os;
  detail::iuCodeMessage::make_message_abi_cxx11_(&local_38,&result->super_iuCodeMessage);
  poVar1 = std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

inline iu_ostream& operator << (iu_ostream& os, const TestPartResult& result)
{
    return os << result.make_message();
}